

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_f16c.cpp
# Opt level: O0

void ncnn::cast_fp16_to_fp32_sse_f16c(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Option *in_stack_00000180;
  Mat *in_stack_00000188;
  Mat *in_stack_00000190;
  
  cast_fp16_to_fp32_sse(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  return;
}

Assistant:

void cast_fp16_to_fp32_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
}